

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall leveldb::KeyConvertingIterator::Seek(KeyConvertingIterator *this,Slice *target)

{
  string encoded;
  ParsedInternalKey ikey;
  string local_58;
  ParsedInternalKey local_38;
  
  local_38.user_key.data_ = target->data_;
  local_38.user_key.size_ = target->size_;
  local_38.sequence = 0xffffffffffffff;
  local_38.type = kTypeValue;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  AppendInternalKey(&local_58,&local_38);
  (*this->iter_->_vptr_Iterator[5])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Seek(const Slice& target) override {
    ParsedInternalKey ikey(target, kMaxSequenceNumber, kTypeValue);
    std::string encoded;
    AppendInternalKey(&encoded, ikey);
    iter_->Seek(encoded);
  }